

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O3

void __thiscall VgaDebugGenerator::LoadTemplate(VgaDebugGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *psVar1;
  optional<Template> temp_opt;
  ifstream temp_fin;
  undefined1 auStack_258 [48];
  bool local_228;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(string *)this,_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) != 0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_258,
                   "Failed to open template file \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_258,
                   "\'");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  Template::From((optional<Template> *)auStack_258,(ifstream *)local_220,(this->config).header_lines
                 ,(this->config).template_width,(this->config).template_height);
  if (local_228 != false) {
    std::vector<Block,_std::allocator<Block>_>::operator=
              (&(this->templte).blocks,(vector<Block,_std::allocator<Block>_> *)auStack_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->templte).lines,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(auStack_258 + 0x18));
    std::_Optional_payload_base<Template>::_M_reset((_Optional_payload_base<Template> *)auStack_258)
    ;
    std::ifstream::~ifstream(local_220);
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar1,"Failed to parse template file due to above reasons","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void VgaDebugGenerator::LoadTemplate() {
    std::ifstream temp_fin(config.template_file);
    if (!temp_fin) {
        throw "Failed to open template file '" + config.template_file + "'";
    }
    auto temp_opt = Template::From(temp_fin, config.header_lines, config.template_width, config.template_height);
    if (!temp_opt.has_value()) {
        throw std::string("Failed to parse template file due to above reasons");
    }
    templte = temp_opt.value();
}